

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

size_t absl::lts_20250127::str_format_internal::anon_unknown_53::WideToUtf8
                 (wchar_t wc,char *buf,ShiftState *s)

{
  byte bVar1;
  uint8_t high_bits;
  uint32_t v;
  ShiftState *s_local;
  char *buf_local;
  size_t sStack_10;
  wchar_t wc_local;
  
  bVar1 = (byte)wc;
  if ((uint)wc < 0x80) {
    *buf = bVar1;
    sStack_10 = 1;
  }
  else if ((uint)wc < 0x800) {
    *buf = (byte)((uint)wc >> 6) | 0xc0;
    buf[1] = bVar1 & 0x3f | 0x80;
    sStack_10 = 2;
  }
  else if (((uint)wc < 0xd800) || ((uint)(wc + L'\xffff2000') < 0x2000)) {
    *buf = (byte)((uint)wc >> 0xc) | 0xe0;
    buf[1] = (byte)((uint)wc >> 6) & 0x3f | 0x80;
    buf[2] = bVar1 & 0x3f | 0x80;
    sStack_10 = 3;
  }
  else if ((uint)(wc + L'\xffff0000') < 0x100000) {
    *buf = (byte)((uint)wc >> 0x12) | 0xf0;
    buf[1] = (byte)((uint)wc >> 0xc) & 0x3f | 0x80;
    buf[2] = (byte)((uint)wc >> 6) & 0x3f | 0x80;
    buf[3] = bVar1 & 0x3f | 0x80;
    sStack_10 = 4;
  }
  else if ((uint)wc < 0xdc00) {
    s->saw_high_surrogate = true;
    s->bits = bVar1 & 3;
    bVar1 = ((byte)((uint)wc >> 6) & 0xf) + 1;
    *buf = (byte)((int)(uint)bVar1 >> 2) | 0xf0;
    buf[1] = (bVar1 & 3) << 4 | 0x80 | (byte)((uint)wc >> 2) & 0xf;
    sStack_10 = 2;
  }
  else if (((uint)wc < 0xe000) && ((s->saw_high_surrogate & 1U) != 0)) {
    *buf = s->bits << 4 | 0x80 | (byte)((uint)wc >> 6) & 0xf;
    buf[1] = bVar1 & 0x3f | 0x80;
    s->saw_high_surrogate = false;
    s->bits = '\0';
    sStack_10 = 2;
  }
  else {
    sStack_10 = 0xffffffffffffffff;
  }
  return sStack_10;
}

Assistant:

inline size_t WideToUtf8(wchar_t wc, char *buf, ShiftState &s) {
  const auto v = static_cast<uint32_t>(wc);
  if (v < 0x80) {
    *buf = static_cast<char>(v);
    return 1;
  } else if (v < 0x800) {
    *buf++ = static_cast<char>(0xc0 | (v >> 6));
    *buf = static_cast<char>(0x80 | (v & 0x3f));
    return 2;
  } else if (v < 0xd800 || (v - 0xe000) < 0x2000) {
    *buf++ = static_cast<char>(0xe0 | (v >> 12));
    *buf++ = static_cast<char>(0x80 | ((v >> 6) & 0x3f));
    *buf = static_cast<char>(0x80 | (v & 0x3f));
    return 3;
  } else if ((v - 0x10000) < 0x100000) {
    *buf++ = static_cast<char>(0xf0 | (v >> 18));
    *buf++ = static_cast<char>(0x80 | ((v >> 12) & 0x3f));
    *buf++ = static_cast<char>(0x80 | ((v >> 6) & 0x3f));
    *buf = static_cast<char>(0x80 | (v & 0x3f));
    return 4;
  } else if (v < 0xdc00) {
    s.saw_high_surrogate = true;
    s.bits = static_cast<uint8_t>(v & 0x3);
    const uint8_t high_bits = ((v >> 6) & 0xf) + 1;
    *buf++ = static_cast<char>(0xf0 | (high_bits >> 2));
    *buf =
        static_cast<char>(0x80 | static_cast<uint8_t>((high_bits & 0x3) << 4) |
                          static_cast<uint8_t>((v >> 2) & 0xf));
    return 2;
  } else if (v < 0xe000 && s.saw_high_surrogate) {
    *buf++ = static_cast<char>(0x80 | static_cast<uint8_t>(s.bits << 4) |
                               static_cast<uint8_t>((v >> 6) & 0xf));
    *buf = static_cast<char>(0x80 | (v & 0x3f));
    s.saw_high_surrogate = false;
    s.bits = 0;
    return 2;
  } else {
    return static_cast<size_t>(-1);
  }
}